

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::runSample
          (BufferInUseRenderTimeCase *this,SampleResult *sample)

{
  pointer *ppuVar1;
  code *pcVar2;
  undefined4 uVar3;
  int iVar4;
  deUint32 dVar5;
  deInt32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  size_type sVar9;
  reference pvVar10;
  deUint64 dVar11;
  deUint64 dVar12;
  reference pvVar13;
  Exception *this_00;
  UnmapFailureError *this_01;
  undefined4 local_24c;
  PixelBufferAccess local_160;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130;
  char local_109;
  void *pvStack_108;
  GLboolean unmapSuccessful;
  void *mapPtr;
  int mapFlags;
  void *source;
  GLintptr offset;
  GLsizeiptr size;
  undefined1 local_d8 [4];
  GLenum target;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  deUint64 endTime;
  deUint64 startTime;
  Surface resultSurface;
  undefined1 local_78 [4];
  int numVertices;
  Buffer alternativeUploadBuffer;
  undefined1 local_50 [8];
  Buffer indexBuffer;
  Buffer arrayBuffer;
  Functions *gl;
  SampleResult *sample_local;
  BufferInUseRenderTimeCase *this_local;
  long lVar8;
  
  pRVar7 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  pRVar7 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexBuffer.super_ObjectWrapper.m_object,
             pRVar7);
  pRVar7 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_50,pRVar7);
  pRVar7 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_78,pRVar7);
  resultSurface.m_pixels.m_cap._4_4_ = getLayeredGridNumVertices(&sample->scene);
  tcu::Surface::Surface((Surface *)&startTime,0x80,0x80);
  ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)ppuVar1,
             &sample->scene);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,&sample->scene);
  }
  pcVar2 = *(code **)(lVar8 + 0x40);
  dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&indexBuffer.super_ObjectWrapper.m_object);
  (*pcVar2)(0x8892,dVar5);
  pcVar2 = *(code **)(lVar8 + 0x40);
  dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
  (*pcVar2)(0x8893,dVar5);
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar2 = *(code **)(lVar8 + 0x150);
    ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       ppuVar1);
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         ppuVar1,0);
    (*pcVar2)(0x8892,sVar9 << 4,pvVar10,0x88e0);
    (**(code **)(lVar8 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    pcVar2 = *(code **)(lVar8 + 0x150);
    ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       ppuVar1);
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         ppuVar1,0);
    (*pcVar2)(0x8892,sVar9 << 4,pvVar10,0x88e0);
    pcVar2 = *(code **)(lVar8 + 0x150);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,0);
    (*pcVar2)(0x8893,sVar9 << 2,pvVar13,0x88e0);
    (**(code **)(lVar8 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
  }
  if (this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    if (*(int *)&(this->
                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                 ).field_0xcc == 0) {
      pcVar2 = *(code **)(lVar8 + 0x40);
      dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_78);
      (*pcVar2)(0x8892,dVar5);
      pcVar2 = *(code **)(lVar8 + 0x150);
      ppuVar1 = &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         ppuVar1);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )ppuVar1,0);
      (*pcVar2)(0x8892,sVar9 << 4,pvVar10,0x88e0);
      RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
      (**(code **)(lVar8 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
    }
    else if (*(int *)&(this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).field_0xcc == 1) {
      pcVar2 = *(code **)(lVar8 + 0x40);
      dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_78);
      (*pcVar2)(0x8893,dVar5);
      pcVar2 = *(code **)(lVar8 + 0x150);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,0);
      (*pcVar2)(0x8893,sVar9 << 2,pvVar13,0x88e0);
      (**(code **)(lVar8 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
    }
    pcVar2 = *(code **)(lVar8 + 0x40);
    dVar5 = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)&indexBuffer.super_ObjectWrapper.m_object);
    (*pcVar2)(0x8892,dVar5);
    pcVar2 = *(code **)(lVar8 + 0x40);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_50);
    (*pcVar2)(0x8893,dVar5);
    RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"post buffer prepare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1468);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  dVar11 = deGetMicroseconds();
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar8 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar8 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.firstRenderDuration = dVar12 - dVar11;
  source = (void *)0x0;
  if ((*(int *)&(this->
                super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                ).field_0xcc == 0) && (this->m_uploadRange == UPLOADRANGE_FULL)) {
    size._4_4_ = 0x8892;
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    offset = sVar9 << 4;
    _mapFlags = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&indexData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,0);
  }
  else if ((*(int *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                     ).field_0xcc == 1) && (this->m_uploadRange == UPLOADRANGE_FULL)) {
    size._4_4_ = 0x8893;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    offset = sVar9 << 2;
    _mapFlags = (reference)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,0);
  }
  else if ((*(int *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                     ).field_0xcc == 0) && (this->m_uploadRange == UPLOADRANGE_PARTIAL)) {
    size._4_4_ = 0x8892;
    sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    dVar6 = deAlign32((deInt32)((long)((ulong)(uint)((int)(sVar9 << 4) >> 0x1f) << 0x20 |
                                      sVar9 << 4 & 0xffffffff) / 2),4);
    offset = (GLintptr)dVar6;
    dVar6 = deAlign32(dVar6 / 2,4);
    source = (void *)(long)dVar6;
    pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    _mapFlags = (reference)((long)pvVar10->m_data + (long)source);
  }
  else {
    if ((*(int *)&(this->
                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                  ).field_0xcc != 1) || (this->m_uploadRange != UPLOADRANGE_PARTIAL)) {
      mapPtr._4_4_ = 1;
      goto LAB_01f5150c;
    }
    size._4_4_ = 0x8893;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    dVar6 = deAlign32((deInt32)((long)((ulong)(uint)((int)(sVar9 << 2) >> 0x1f) << 0x20 |
                                      sVar9 << 2 & 0xffffffff) / 2),4);
    offset = (GLintptr)dVar6;
    dVar6 = deAlign32(dVar6 / 2,4);
    source = (void *)(long)dVar6;
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,0);
    _mapFlags = (reference)((long)pvVar13 + (long)source);
  }
  uVar3 = size._4_4_;
  if (this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    pcVar2 = *(code **)(lVar8 + 0x40);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_78);
    (*pcVar2)(uVar3,dVar5);
  }
  dVar11 = deGetMicroseconds();
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) {
    (**(code **)(lVar8 + 0x150))(size._4_4_,offset,_mapFlags,0x88e0);
  }
  else if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    (**(code **)(lVar8 + 0x168))(size._4_4_,source,offset,_mapFlags);
  }
  else if (this->m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    if (this->m_mapFlags == MAPFLAG_INVALIDATE_BUFFER) {
      local_24c = 10;
    }
    else {
      local_24c = 0xffffffff;
      if (this->m_mapFlags == MAPFLAG_INVALIDATE_RANGE) {
        local_24c = 6;
      }
    }
    mapPtr._0_4_ = local_24c;
    pvStack_108 = (void *)(**(code **)(lVar8 + 0xd00))(size._4_4_,source,offset,local_24c);
    if (pvStack_108 == (void *)0x0) {
      local_132 = 1;
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"MapBufferRange returned NULL",&local_131);
      tcu::Exception::Exception(this_00,&local_130);
      local_132 = 0;
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    ::deMemcpy(pvStack_108,_mapFlags,(long)(int)offset);
    local_109 = (**(code **)(lVar8 + 0x1670))(size._4_4_);
    if (local_109 == '\0') {
      this_01 = (UnmapFailureError *)__cxa_allocate_exception(8);
      UnmapFailureError::UnmapFailureError(this_01);
      __cxa_throw(this_01,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  UnmapFailureError::~UnmapFailureError);
    }
  }
  dVar12 = deGetMicroseconds();
  (sample->result).uploadedDataSize = (int)offset;
  (sample->result).duration.uploadDuration = dVar12 - dVar11;
  if ((this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) &&
     (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
               ).field_0xcc == 0)) {
    RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  }
  dVar11 = deGetMicroseconds();
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar8 + 0x538))(4,0,resultSurface.m_pixels.m_cap._4_4_);
  }
  else if ((this->
           super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
           ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar8 + 0x568))(4,resultSurface.m_pixels.m_cap._4_4_,0x1405,0);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.secondRenderDuration = dVar12 - dVar11;
  dVar11 = deGetMicroseconds();
  pRVar7 = gles3::Context::getRenderContext
                     ((this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      ).super_RenderPerformanceTestBase.super_TestCase.m_context);
  tcu::Surface::getAccess(&local_160,(Surface *)&startTime);
  glu::readPixels(pRVar7,0,0,&local_160);
  dVar12 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar12 - dVar11;
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getVertexDataSize(&this->
                               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                             );
  (sample->result).renderDataSize = iVar4 * (sample->result).numVertices;
  (sample->result).duration.renderReadDuration =
       (sample->result).duration.secondRenderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.totalDuration =
       (sample->result).duration.firstRenderDuration + (sample->result).duration.uploadDuration +
       (sample->result).duration.secondRenderDuration + (sample->result).duration.readDuration;
  (sample->result).duration.fitResponseDuration = (sample->result).duration.renderReadDuration;
  mapPtr._4_4_ = 0;
LAB_01f5150c:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface((Surface *)&startTime);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_78);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_50);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&indexBuffer.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void BufferInUseRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const glu::Buffer		arrayBuffer				(m_context.getRenderContext());
	const glu::Buffer		indexBuffer				(m_context.getRenderContext());
	const glu::Buffer		alternativeUploadBuffer	(m_context.getRenderContext());
	const int				numVertices				= getLayeredGridNumVertices(sample.scene);
	tcu::Surface			resultSurface			(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	deUint64				startTime;
	deUint64				endTime;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;

	// create data

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		generateLayeredGridIndexData(indexData, sample.scene);

	// make buffers used

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
	setupVertexAttribs();

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STREAM_DRAW);
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	}
	else
		DE_ASSERT(false);

	// another pair of buffers for reference case
	if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER)
	{
		if (m_targetBuffer == TARGETBUFFER_VERTEX)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, *alternativeUploadBuffer);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);

			setupVertexAttribs();
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX)
		{
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *alternativeUploadBuffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STREAM_DRAW);
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		}
		else
			DE_ASSERT(false);

		// restore state
		gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		setupVertexAttribs();
	}

	waitGLResults();
	GLU_EXPECT_NO_ERROR(gl.getError(), "post buffer prepare");

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// first draw
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.firstRenderDuration = endTime - startTime;
	}

	// upload
	{
		glw::GLenum		target;
		glw::GLsizeiptr	size;
		glw::GLintptr	offset = 0;
		const void*		source;

		if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4));
			source	= &vertexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32));
			source	= &indexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((int)(vertexData.size() * sizeof(tcu::Vec4)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&vertexData[0] + offset;
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			// upload to 25% - 75% range
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((deInt32)(indexData.size() * sizeof(deUint32)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&indexData[0] + offset;
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		// reference case? don't modify the buffer in use
		if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER)
			gl.bindBuffer(target, *alternativeUploadBuffer);

		startTime = deGetMicroseconds();

		if (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)
			gl.bufferData(target, size, source, GL_STREAM_DRAW);
		else if (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
			gl.bufferSubData(target, offset, size, source);
		else if (m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
		{
			const int		mapFlags	= (m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT)	:
										  (m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT)	:
										  (-1);
			void*			mapPtr;
			glw::GLboolean	unmapSuccessful;

			mapPtr = gl.mapBufferRange(target, offset, size, mapFlags);
			if (!mapPtr)
				throw tcu::Exception("MapBufferRange returned NULL");

			deMemcpy(mapPtr, source, (int)size);

			// if unmapping fails, just try again later
			unmapSuccessful = gl.unmapBuffer(target);
			if (!unmapSuccessful)
				throw UnmapFailureError();
		}
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.uploadedDataSize = (int)size;
		sample.result.duration.uploadDuration = endTime - startTime;
	}

	// second draw
	{
		// Source vertex data from alternative buffer in refernce case
		if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER && m_targetBuffer == TARGETBUFFER_VERTEX)
			setupVertexAttribs();

		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.secondRenderDuration = endTime - startTime;
	}

	// read
	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	// set results

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;

	sample.result.duration.renderReadDuration	= sample.result.duration.secondRenderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration		= sample.result.duration.firstRenderDuration +
												  sample.result.duration.uploadDuration +
												  sample.result.duration.secondRenderDuration +
												  sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration	= sample.result.duration.renderReadDuration;
}